

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * touserdata(TValue *o)

{
  byte bVar1;
  long local_30;
  TValue *o_local;
  
  bVar1 = o->tt_ & 0xf;
  if (bVar1 == 2) {
    o_local = (TValue *)(o->value_).gc;
  }
  else if (bVar1 == 7) {
    if (*(short *)((o->value_).f + 10) == 0) {
      local_30 = 0x20;
    }
    else {
      local_30 = (ulong)*(ushort *)((o->value_).f + 10) * 0x10 + 0x28;
    }
    o_local = (TValue *)((long)&((o->value_).gc)->next + local_30);
  }
  else {
    o_local = (TValue *)0x0;
  }
  return o_local;
}

Assistant:

l_sinline void *touserdata (const TValue *o) {
  switch (ttype(o)) {
    case LUA_TUSERDATA: return getudatamem(uvalue(o));
    case LUA_TLIGHTUSERDATA: return pvalue(o);
    default: return NULL;
  }
}